

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O0

void bashPrgCommit(octet code,void *state)

{
  octet *in_RSI;
  byte in_DIL;
  bash_prg_st *st;
  
  in_RSI[*(long *)(in_RSI + 0xd8) + 0x10] = in_RSI[*(long *)(in_RSI + 0xd8) + 0x10] ^ in_DIL;
  in_RSI[*(long *)(in_RSI + 0xd0) + 0x10] = in_RSI[*(long *)(in_RSI + 0xd0) + 0x10] ^ 0x80;
  bashF(in_RSI,in_RSI);
  in_RSI[0xd8] = '\0';
  in_RSI[0xd9] = '\0';
  in_RSI[0xda] = '\0';
  in_RSI[0xdb] = '\0';
  in_RSI[0xdc] = '\0';
  in_RSI[0xdd] = '\0';
  in_RSI[0xde] = '\0';
  in_RSI[0xdf] = '\0';
  return;
}

Assistant:

static void bashPrgCommit(octet code, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsValid(st, bashPrg_keep()));
	ASSERT(st->pos < st->buf_len);
	// учесть code
	st->s[st->pos] ^= code;
	// инвертировать контрольный бит
	st->s[st->buf_len] ^= 0x80;
	// применить sponge-функцию
	bashF(st->s, st->stack);
	// сбросить pos
	st->pos = 0;
}